

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O3

bool __thiscall llvm::yaml::Output::mapTag(Output *this,StringRef Tag,bool Use)

{
  void *pvVar1;
  bool bVar2;
  ulong uVar3;
  undefined7 in_register_00000009;
  StringRef Str;
  InState local_3c;
  SmallVector<llvm::yaml::Output::InState,_8U> *local_38;
  
  if ((int)CONCAT71(in_register_00000009,Use) == 0) {
    return Use;
  }
  local_38 = &this->StateStack;
  uVar3 = (ulong)(this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
                 super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
                 super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.
                 super_SmallVectorBase.Size;
  if ((uVar3 < 2) ||
     (pvVar1 = (local_38->super_SmallVectorImpl<llvm::yaml::Output::InState>).
               super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
               super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.
               super_SmallVectorBase.BeginX, 3 < *(uint *)((long)pvVar1 + uVar3 * 4 + -8))) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if (*(int *)((long)pvVar1 + uVar3 * 4 + -4) == 4) {
      newLineCheck(this);
      this->Column = this->Column + (int)Tag.Length;
      raw_ostream::operator<<(this->Out,Tag);
      goto LAB_00dacf22;
    }
  }
  this->Column = this->Column + 1;
  Str.Length = 1;
  Str.Data = " ";
  raw_ostream::operator<<(this->Out,Str);
  this->Column = this->Column + (int)Tag.Length;
  raw_ostream::operator<<(this->Out,Tag);
  if (!bVar2) {
    return Use;
  }
LAB_00dacf22:
  uVar3 = (ulong)(this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
                 super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
                 super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.
                 super_SmallVectorBase.Size;
  if (uVar3 == 0) {
    __assert_fail("!empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                  ,0xa7,
                  "reference llvm::SmallVectorTemplateCommon<llvm::yaml::Output::InState>::back() [T = llvm::yaml::Output::InState]"
                 );
  }
  if (*(int *)((long)(local_38->super_SmallVectorImpl<llvm::yaml::Output::InState>).
                     super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
                     super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.
                     super_SmallVectorBase.BeginX + uVar3 * 4 + -4) == 4) {
    if ((ulong)(this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
               super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
               super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.
               super_SmallVectorBase.Capacity < uVar3 - 1) {
      __assert_fail("N <= capacity()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                    ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
    }
    (this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
    super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
    super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.super_SmallVectorBase.Size =
         (uint)(uVar3 - 1);
    local_3c = inMapOtherKey;
    SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>::push_back
              ((SmallVectorTemplateBase<llvm::yaml::Output::InState,_true> *)local_38,&local_3c);
  }
  (this->Padding).Data = "\n";
  (this->Padding).Length = 1;
  return Use;
}

Assistant:

bool Output::mapTag(StringRef Tag, bool Use) {
  if (Use) {
    // If this tag is being written inside a sequence we should write the start
    // of the sequence before writing the tag, otherwise the tag won't be
    // attached to the element in the sequence, but rather the sequence itself.
    bool SequenceElement = false;
    if (StateStack.size() > 1) {
      auto &E = StateStack[StateStack.size() - 2];
      SequenceElement = inSeqAnyElement(E) || inFlowSeqAnyElement(E);
    }
    if (SequenceElement && StateStack.back() == inMapFirstKey) {
      newLineCheck();
    } else {
      output(" ");
    }
    output(Tag);
    if (SequenceElement) {
      // If we're writing the tag during the first element of a map, the tag
      // takes the place of the first element in the sequence.
      if (StateStack.back() == inMapFirstKey) {
        StateStack.pop_back();
        StateStack.push_back(inMapOtherKey);
      }
      // Tags inside maps in sequences should act as keys in the map from a
      // formatting perspective, so we always want a newline in a sequence.
      Padding = "\n";
    }
  }
  return Use;
}